

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qplaintextedit.cpp
# Opt level: O2

void __thiscall
QPlainTextEdit::QPlainTextEdit(QPlainTextEdit *this,QPlainTextEditPrivate *dd,QWidget *parent)

{
  long in_FS_OFFSET;
  QArrayDataPointer<char16_t> local_28;
  long local_10;
  
  local_10 = *(long *)(in_FS_OFFSET + 0x28);
  QAbstractScrollArea::QAbstractScrollArea
            ((QAbstractScrollArea *)this,&dd->super_QAbstractScrollAreaPrivate,parent);
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget =
       &PTR_metaObject_007d64f0;
  *(undefined ***)&(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.super_QPaintDevice =
       &PTR__QPlainTextEdit_007d66f0;
  local_28.d = (Data *)0x0;
  local_28.ptr = (char16_t *)0x0;
  local_28.size = 0;
  QPlainTextEditPrivate::init
            (*(QPlainTextEditPrivate **)
              &(this->super_QAbstractScrollArea).super_QFrame.super_QWidget.field_0x8,
             (EVP_PKEY_CTX *)&local_28);
  QArrayDataPointer<char16_t>::~QArrayDataPointer(&local_28);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_10) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

QPlainTextEdit::QPlainTextEdit(QPlainTextEditPrivate &dd, QWidget *parent)
    : QAbstractScrollArea(dd, parent)
{
    Q_D(QPlainTextEdit);
    d->init();
}